

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O1

int cpu_memory_rw_debug_mips64
              (CPUState *cpu,target_ulong_conflict addr,void *ptr,target_ulong_conflict len,
              _Bool is_write)

{
  _func_hwaddr_CPUState_ptr_vaddr_MemTxAttrs_ptr_conflict *p_Var1;
  _func_int_CPUState_ptr_MemTxAttrs_conflict *p_Var2;
  AddressSpace *pAVar3;
  void *pvVar4;
  uint uVar5;
  hwaddr hVar6;
  undefined4 in_register_0000000c;
  hwaddr addr_00;
  ulong uVar8;
  undefined4 in_register_00000034;
  undefined7 in_register_00000081;
  ulong len_00;
  ulong uVar9;
  ulong uVar10;
  MemTxAttrs attrs;
  MemTxAttrs in_stack_ffffffffffffffb8;
  MemTxAttrs local_44;
  void *local_40;
  undefined4 local_34;
  ulong uVar7;
  
  uVar10 = CONCAT44(in_register_00000034,addr);
  uVar9 = CONCAT44(in_register_0000000c,len);
  local_34 = (undefined4)CONCAT71(in_register_00000081,is_write);
  do {
    if (uVar9 == 0) {
      return 0;
    }
    uVar8 = uVar10 & 0xfffffffffffff000;
    p_Var1 = cpu->cc->get_phys_page_attrs_debug;
    local_40 = ptr;
    if (p_Var1 == (_func_hwaddr_CPUState_ptr_vaddr_MemTxAttrs_ptr_conflict *)0x0) {
      local_44 = (MemTxAttrs)0x1;
      hVar6 = (*cpu->cc->get_phys_page_debug)((CPUState_conflict *)cpu,uVar8);
    }
    else {
      hVar6 = (*p_Var1)((CPUState_conflict *)cpu,uVar8,&local_44);
    }
    p_Var2 = cpu->cc->asidx_from_attrs;
    if (p_Var2 == (_func_int_CPUState_ptr_MemTxAttrs_conflict *)0x0) {
      uVar7 = 0;
    }
    else {
      uVar5 = (*p_Var2)((CPUState_conflict *)cpu,in_stack_ffffffffffffffb8);
      uVar7 = (ulong)uVar5;
      if (((int)uVar5 < 0) || (cpu->num_ases <= (int)uVar5)) {
        __assert_fail("ret < cpu->num_ases && ret >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/hw/core/cpu.h"
                      ,0x1a5,"int cpu_asidx_from_attrs(CPUState *, MemTxAttrs)");
      }
    }
    pvVar4 = local_40;
    if (hVar6 != 0xffffffffffffffff) {
      len_00 = (uVar8 + 0x1000) - uVar10;
      if (uVar9 <= len_00) {
        len_00 = uVar9;
      }
      addr_00 = ((uint)uVar10 & 0xfff) + hVar6;
      if ((char)local_34 == '\0') {
        if (uVar8 + 0x1000 != uVar10) {
          pAVar3 = cpu->cpu_ases[uVar7].as;
          flatview_read((uc_struct_conflict6 *)pAVar3->uc,pAVar3->current_map,addr_00,local_44,
                        local_40,len_00);
        }
      }
      else {
        address_space_write_rom_mips64(cpu->cpu_ases[uVar7].as,addr_00,local_44,local_40,len_00);
      }
      uVar9 = uVar9 - len_00;
      local_40 = (void *)((long)pvVar4 + len_00);
      uVar10 = uVar10 + len_00;
    }
    ptr = local_40;
  } while (hVar6 != 0xffffffffffffffff);
  return -1;
}

Assistant:

int cpu_memory_rw_debug(CPUState *cpu, target_ulong addr,
                        void *ptr, target_ulong len, bool is_write)
{
#ifdef TARGET_ARM
    struct uc_struct *uc = cpu->uc;
#endif
    hwaddr phys_addr;
    target_ulong l, page;
    uint8_t *buf = ptr;

    while (len > 0) {
        int asidx;
        MemTxAttrs attrs;

        page = addr & TARGET_PAGE_MASK;
        phys_addr = cpu_get_phys_page_attrs_debug(cpu, page, &attrs);
        asidx = cpu_asidx_from_attrs(cpu, attrs);
        /* if no physical page mapped, return an error */
        if (phys_addr == -1)
            return -1;
        l = (page + TARGET_PAGE_SIZE) - addr;
        if (l > len)
            l = len;
        phys_addr += (addr & ~TARGET_PAGE_MASK);
        if (is_write) {
            address_space_write_rom(cpu->cpu_ases[asidx].as, phys_addr,
                                    attrs, buf, l);
        } else {
            address_space_read(cpu->cpu_ases[asidx].as, phys_addr, attrs, buf,
                               l);
        }
        len -= l;
        buf += l;
        addr += l;
    }
    return 0;
}